

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> * __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator=
          (ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->numActive = 0;
  if (4 < this->numAllocated) {
    if (this->items != (pool_ref<soul::heart::Expression> *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (pool_ref<soul::heart::Expression> *)this->space;
    this->numAllocated = 4;
  }
  uVar1 = other->numAllocated;
  if (uVar1 < 5) {
    sVar2 = other->numActive;
    this->numActive = sVar2;
    if (sVar2 != 0) {
      sVar3 = 0;
      do {
        this->items[sVar3].object = other->items[sVar3].object;
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (pool_ref<soul::heart::Expression> *)other->space;
    other->numAllocated = 4;
    other->numActive = 0;
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }